

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConfigInstanceIdentifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigInstanceIdentifierSyntax,slang::syntax::ConfigInstanceIdentifierSyntax_const&>
          (BumpAllocator *this,ConfigInstanceIdentifierSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ConfigInstanceIdentifierSyntax *pCVar13;
  
  pCVar13 = (ConfigInstanceIdentifierSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->dot).kind;
  uVar6 = (args->dot).field_0x2;
  NVar7.raw = (args->dot).numFlags.raw;
  uVar8 = (args->dot).rawLen;
  pIVar3 = (args->dot).info;
  TVar9 = (args->name).kind;
  uVar10 = (args->name).field_0x2;
  NVar11.raw = (args->name).numFlags.raw;
  uVar12 = (args->name).rawLen;
  (pCVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pCVar13->super_SyntaxNode).parent = pSVar1;
  (pCVar13->super_SyntaxNode).previewNode = pSVar2;
  (pCVar13->dot).kind = TVar5;
  (pCVar13->dot).field_0x2 = uVar6;
  (pCVar13->dot).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar13->dot).rawLen = uVar8;
  (pCVar13->dot).info = pIVar3;
  (pCVar13->name).kind = TVar9;
  (pCVar13->name).field_0x2 = uVar10;
  (pCVar13->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar13->name).rawLen = uVar12;
  (pCVar13->name).info = (args->name).info;
  return pCVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }